

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::Pop(ScriptContext *scriptContext,Var object)

{
  bool bVar1;
  JavascriptArray *arr;
  Var object_local;
  ScriptContext *scriptContext_local;
  
  bVar1 = IsNonES5Array(object);
  if (bVar1) {
    arr = VarTo<Js::JavascriptArray>(object);
    scriptContext_local = (ScriptContext *)EntryPopJavascriptArray(scriptContext,arr);
  }
  else {
    scriptContext_local = (ScriptContext *)EntryPopNonJavascriptArray(scriptContext,object);
  }
  return scriptContext_local;
}

Assistant:

Var JavascriptArray::Pop(ScriptContext * scriptContext, Var object)
    {
        JIT_HELPER_REENTRANT_HEADER(Array_VarPop);
        if (JavascriptArray::IsNonES5Array(object))
        {
            return EntryPopJavascriptArray(scriptContext, VarTo<JavascriptArray>(object));
        }
        else
        {
            return EntryPopNonJavascriptArray(scriptContext, object);
        }
        JIT_HELPER_END(Array_VarPop);
    }